

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

iterator __thiscall
glslang::TDefaultIoResolverBase::findSlot(TDefaultIoResolverBase *this,int set,int slot)

{
  mapped_type *pmVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  int local_20;
  int local_1c;
  int slot_local;
  int set_local;
  TDefaultIoResolverBase *this_local;
  
  local_20 = slot;
  local_1c = set;
  _slot_local = this;
  pmVar1 = std::
           unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&this->slots,&local_1c);
  __first = std::vector<int,_std::allocator<int>_>::begin(pmVar1);
  pmVar1 = std::
           unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&this->slots,&local_1c);
  __last = std::vector<int,_std::allocator<int>_>::end(pmVar1);
  _Var2 = std::
          lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                    (__first._M_current,__last._M_current,&local_20);
  return (iterator)_Var2._M_current;
}

Assistant:

TDefaultIoResolverBase::TSlotSet::iterator TDefaultIoResolverBase::findSlot(int set, int slot) {
    return std::lower_bound(slots[set].begin(), slots[set].end(), slot);
}